

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void emit_dht(j_compress_ptr cinfo,int index,boolean is_ac)

{
  int local_28;
  int local_24;
  int i;
  int length;
  JHUFF_TBL *htbl;
  boolean is_ac_local;
  int index_local;
  j_compress_ptr cinfo_local;
  
  if (is_ac == 0) {
    _i = cinfo->dc_huff_tbl_ptrs[index];
    htbl._4_4_ = index;
  }
  else {
    _i = cinfo->ac_huff_tbl_ptrs[index];
    htbl._4_4_ = index + 0x10;
  }
  if (_i == (JHUFF_TBL *)0x0) {
    cinfo->err->msg_code = 0x34;
    (cinfo->err->msg_parm).i[0] = htbl._4_4_;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (_i->sent_table == 0) {
    emit_marker(cinfo,M_DHT);
    local_24 = 0;
    for (local_28 = 1; local_28 < 0x11; local_28 = local_28 + 1) {
      local_24 = (uint)_i->bits[local_28] + local_24;
    }
    emit_2bytes(cinfo,local_24 + 0x13);
    emit_byte(cinfo,htbl._4_4_);
    for (local_28 = 1; local_28 < 0x11; local_28 = local_28 + 1) {
      emit_byte(cinfo,(uint)_i->bits[local_28]);
    }
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      emit_byte(cinfo,(uint)_i->huffval[local_28]);
    }
    _i->sent_table = 1;
  }
  return;
}

Assistant:

LOCAL(void)
emit_dht (j_compress_ptr cinfo, int index, boolean is_ac)
/* Emit a DHT marker */
{
  JHUFF_TBL * htbl;
  int length, i;
  
  if (is_ac) {
    htbl = cinfo->ac_huff_tbl_ptrs[index];
    index += 0x10;		/* output index has AC bit set */
  } else {
    htbl = cinfo->dc_huff_tbl_ptrs[index];
  }

  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, index);
  
  if (! htbl->sent_table) {
    emit_marker(cinfo, M_DHT);
    
    length = 0;
    for (i = 1; i <= 16; i++)
      length += htbl->bits[i];
    
    emit_2bytes(cinfo, length + 2 + 1 + 16);
    emit_byte(cinfo, index);
    
    for (i = 1; i <= 16; i++)
      emit_byte(cinfo, htbl->bits[i]);
    
    for (i = 0; i < length; i++)
      emit_byte(cinfo, htbl->huffval[i]);
    
    htbl->sent_table = TRUE;
  }
}